

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserCtxtPtr xmlNewParserCtxt(void)

{
  int iVar1;
  xmlParserCtxtPtr ctxt;
  
  ctxt = (xmlParserCtxtPtr)(*xmlMalloc)(0x300);
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    xmlErrMemory((xmlParserCtxtPtr)0x0,"cannot allocate parser context\n");
    ctxt = (xmlParserCtxtPtr)0x0;
  }
  else {
    memset(ctxt,0,0x300);
    iVar1 = xmlInitParserCtxt(ctxt);
    if (iVar1 < 0) {
      xmlFreeParserCtxt(ctxt);
      ctxt = (xmlParserCtxtPtr)0x0;
    }
  }
  return ctxt;
}

Assistant:

xmlParserCtxtPtr
xmlNewParserCtxt(void)
{
    xmlParserCtxtPtr ctxt;

    ctxt = (xmlParserCtxtPtr) xmlMalloc(sizeof(xmlParserCtxt));
    if (ctxt == NULL) {
	xmlErrMemory(NULL, "cannot allocate parser context\n");
	return(NULL);
    }
    memset(ctxt, 0, sizeof(xmlParserCtxt));
    if (xmlInitParserCtxt(ctxt) < 0) {
        xmlFreeParserCtxt(ctxt);
	return(NULL);
    }
    return(ctxt);
}